

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall test_message2_sizes::test_method(test_message2_sizes *this)

{
  shared_count *this_00;
  assertion_result local_f0;
  char *local_d8;
  char *local_d0;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_const_unsigned_long_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  local_c8;
  unsigned_long size;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  lazy_ostream local_70;
  undefined1 *local_60;
  char **local_58;
  const_string local_50;
  const_string local_40;
  
  size = 0x3a;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x116,&local_50);
  local_c8.m_lhs.m_value = 0x3a;
  local_c8.m_rhs = &size;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_const_unsigned_long_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  ::evaluate(&local_f0,&local_c8,false);
  local_d8 = "msg.body_size() == size";
  local_d0 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_80.m_end = "";
  local_58 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_70,&local_80,0x116,CHECK,CHECK_BUILT_ASSERTION,0);
  this_00 = &local_f0.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_90.m_end = "";
  local_a0.m_begin = "";
  local_a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_90,0x117,&local_a0);
  local_c8.m_lhs.m_value = 0x3f;
  local_c8.m_rhs = (unsigned_long *)0x3f;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  ::evaluate(&local_f0,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
              *)&local_c8,false);
  local_d8 = "msg.size() == sizeof(message_header) + size";
  local_d0 = "";
  local_70.m_empty = false;
  local_70._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_60 = boost::unit_test::lazy_ostream::inst;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_b0.m_end = "";
  local_58 = &local_d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_70,&local_b0,0x117,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_message2_sizes)
{
    #pragma pack(push, 1)
    struct test_message2 final : public basic_message<test_message2, message_id::UNDEFINED>
    {
        std::uint8_t a;
        std::uint32_t b;
        std::uint8_t c;
        float d;
        std::array<std::uint8_t, 27> e;
        double f;
        std::uint8_t g;
        std::array<std::uint32_t, 3> h;
    };
    #pragma pack(pop)

    const auto size = sizeof(std::uint8_t)
        + sizeof(std::uint32_t)
        + sizeof(std::uint8_t)
        + sizeof(float)
        + sizeof(std::array<std::uint8_t, 27>)
        + sizeof(double)
        + sizeof(std::uint8_t)
        + sizeof(std::array<std::uint32_t, 3>);

    const auto msg = test_message2{};

    BOOST_TEST(msg.body_size() == size);
    BOOST_TEST(msg.size() == sizeof(message_header) + size);
}